

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# feature_index.cpp
# Opt level: O3

char * __thiscall
MeCab::FeatureIndex::getIndex(FeatureIndex *this,char **p,char **column,size_t max)

{
  char cVar1;
  byte bVar2;
  ostream *poVar3;
  char *pcVar4;
  char cVar5;
  ulong uVar6;
  die local_42;
  die local_41;
  char **local_40;
  ulong local_38;
  
  pcVar4 = *p;
  *p = pcVar4 + 1;
  cVar1 = pcVar4[1];
  cVar5 = cVar1;
  if (cVar1 == '?') {
    *p = pcVar4 + 2;
    cVar5 = pcVar4[2];
  }
  if (cVar5 != '[') {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/feature_index.cpp"
               ,0x73);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"(",1);
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x2b);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,") [",3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"**p ==\'[\'",9);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"] ",2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"getIndex(): unmatched \'[\'",0x19);
    die::~die(&local_41);
  }
  uVar6 = 0;
  local_40 = column;
  local_38 = max;
  while( true ) {
    while( true ) {
      pcVar4 = *p;
      *p = pcVar4 + 1;
      bVar2 = pcVar4[1];
      if (9 < bVar2 - 0x30) break;
      uVar6 = ((ulong)bVar2 + uVar6 * 10) - 0x30;
    }
    if (bVar2 == 0x5d) break;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/feature_index.cpp"
               ,0x73);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"(",1);
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x42);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,") [",3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"false",5);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"] ",2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"unmatched \'[\'",0xd);
    die::~die(&local_42);
  }
  if (uVar6 < local_38) {
    pcVar4 = local_40[uVar6];
    if (cVar1 == '?') {
      if (*pcVar4 == '*') {
        if (pcVar4[1] == '\0') {
          pcVar4 = (char *)0x0;
        }
      }
      else if (*pcVar4 == '\0') {
        pcVar4 = (char *)0x0;
      }
    }
  }
  else {
    pcVar4 = (char *)0x0;
  }
  return pcVar4;
}

Assistant:

const char* FeatureIndex::getIndex(char **p, char **column, size_t max) {
  ++(*p);

  bool flg = false;

  if (**p == '?') {
    flg = true;
    ++(*p);
  }  // undef flg

  CHECK_DIE(**p =='[') << "getIndex(): unmatched '['";

  size_t n = 0;
  ++(*p);

  for (;; ++(*p)) {
    switch (**p) {
      case '0': case '1': case '2': case '3': case '4':
      case '5': case '6': case '7': case '8': case '9':
        n = 10 * n + (**p - '0');
        break;
      case ']':
        if (n >= max) {
          return 0;
        }

        if (flg == true && ((std::strcmp("*", column[n]) == 0)
                            || column[n][0] == '\0')) {
          return 0;
        }
        return column[n];  // return;
        break;
      default:
        CHECK_DIE(false) << "unmatched '['";
    }
  }

  return 0;
}